

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

int __thiscall rw::StreamFile::open(StreamFile *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  char *pcVar2;
  Error _e;
  Error local_28;
  
  pFVar1 = fopen(__file,___oflag);
  this->file = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    local_28.plugin = 0;
    local_28.code = 0x80000003;
    this = (StreamFile *)0x0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/base.cpp",
            0x3ec);
    pFVar1 = _stderr;
    pcVar2 = dbgsprint(0x80000003,__file);
    fprintf(pFVar1,"%s\n",pcVar2);
    setError(&local_28);
  }
  return (int)this;
}

Assistant:

StreamFile*
StreamFile::open(const char *path, const char *mode)
{
	assert(this->file == nil);
	this->file = fopen(path, mode);
	if(this->file == nil){
		RWERROR((ERR_FILE, path));
		return nil;
	}
	return this;
}